

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O2

SparseTextureProperties *
Diligent::GetStandardSparseTextureProperties
          (SparseTextureProperties *__return_storage_ptr__,TextureDesc *TexDesc)

{
  Uint32 *TileSize;
  RESOURCE_DIMENSION RVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  Uint32 UVar5;
  TextureFormatAttribs *pTVar6;
  ulong uVar7;
  Uint32 i;
  uint uVar8;
  char (*Args_1) [54];
  Uint64 UVar9;
  uint uVar10;
  Uint64 UVar11;
  Uint32 Mip;
  uint uVar12;
  uint3 uVar13;
  string msg;
  Uint64 local_50;
  Box local_48;
  
  pTVar6 = GetTextureFormatAttribs(TexDesc->Format);
  Args_1 = (char (*) [54])(ulong)pTVar6->NumComponents;
  if (pTVar6->ComponentType == COMPONENT_TYPE_COMPRESSED) {
    Args_1 = (char (*) [54])0x1;
  }
  uVar10 = (int)Args_1 * (uint)pTVar6->ComponentSize;
  uVar8 = uVar10 - 1;
  if ((uVar10 ^ uVar8) <= uVar8) {
    FormatString<char[26],char[24]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"IsPowerOfTwo(TexelSize)",(char (*) [24])Args_1);
    Args_1 = (char (*) [54])0xb34;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetStandardSparseTextureProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0xb34);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (0xf < uVar8) {
    FormatString<char[26],char[34]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"TexelSize >= 1 && TexelSize <= 16",(char (*) [34])Args_1);
    Args_1 = (char (*) [54])0xb35;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetStandardSparseTextureProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0xb35);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (4 < (byte)(TexDesc->Type - RESOURCE_DIM_TEX_2D)) {
    FormatString<char[26],char[33]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"TexDesc.Is2D() || TexDesc.Is3D()",(char (*) [33])Args_1);
    Args_1 = (char (*) [54])0xb36;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetStandardSparseTextureProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0xb36);
    std::__cxx11::string::~string((string *)&msg);
  }
  UVar5 = TexDesc->MipLevels;
  if (UVar5 == 0) {
    FormatString<char[46]>(&msg,(char (*) [46])"Number of mipmap calculation is not supported");
    Args_1 = (char (*) [54])0xb37;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetStandardSparseTextureProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0xb37);
    std::__cxx11::string::~string((string *)&msg);
    UVar5 = TexDesc->MipLevels;
  }
  if ((TexDesc->SampleCount != 1) && (UVar5 != 1)) {
    FormatString<char[44]>(&msg,(char (*) [44])"Multisampled textures must have 1 mip level");
    Args_1 = (char (*) [54])0xb38;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetStandardSparseTextureProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0xb38);
    std::__cxx11::string::~string((string *)&msg);
  }
  __return_storage_ptr__->MipTailStride = 0;
  __return_storage_ptr__->MipTailSize = 0;
  __return_storage_ptr__->AddressSpaceSize = 0;
  __return_storage_ptr__->MipTailOffset = 0;
  __return_storage_ptr__->FirstMipInTail = 0xffffffff;
  TileSize = __return_storage_ptr__->TileSize;
  __return_storage_ptr__->TileSize[0] = 0;
  __return_storage_ptr__->TileSize[1] = 0;
  *(undefined8 *)(__return_storage_ptr__->TileSize + 2) = 0;
  __return_storage_ptr__->Flags = SPARSE_TEXTURE_FLAG_NONE;
  if (TexDesc->Type == RESOURCE_DIM_TEX_3D) {
    if (pTVar6->ComponentType == COMPONENT_TYPE_COMPRESSED) {
      FormatString<char[58]>
                (&msg,(char (*) [58])"Compressed sparse 3D textures are currently not supported");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"GetStandardSparseTextureProperties",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0xb3e);
      std::__cxx11::string::~string((string *)&msg);
    }
    __return_storage_ptr__->TileSize[0] = 0x40;
    __return_storage_ptr__->TileSize[1] = 0x20;
    __return_storage_ptr__->TileSize[2] = 0x20;
    for (uVar8 = 0; (uint)(1 << ((byte)uVar8 & 0x1f)) < uVar10; uVar8 = uVar8 + 1) {
      TileSize[*(long *)(&DAT_002ee580 + ((ulong)uVar8 % 3) * 8)] =
           TileSize[*(long *)(&DAT_002ee580 + ((ulong)uVar8 % 3) * 8)] >> 1;
    }
    uVar8 = TexDesc->SampleCount;
    goto LAB_002835c9;
  }
  uVar8 = TexDesc->SampleCount;
  if (uVar8 < 2) {
    __return_storage_ptr__->TileSize[0] = 0x100;
    __return_storage_ptr__->TileSize[1] = 0x100;
    __return_storage_ptr__->TileSize[2] = 1;
    if (pTVar6->ComponentType == COMPONENT_TYPE_COMPRESSED) {
      bVar2 = pTVar6->ComponentSize;
      bVar3 = pTVar6->BlockWidth;
      bVar4 = pTVar6->BlockHeight;
      for (uVar12 = 0;
          (int)((uint)bVar2 << ((byte)uVar12 & 0x1f)) < (int)((uint)bVar4 * (uint)bVar3);
          uVar12 = uVar12 + 1) {
        TileSize[uVar12 & 1] = TileSize[uVar12 & 1] << 1;
      }
    }
    else {
      for (uVar12 = 0; (uint)(1 << ((byte)uVar12 & 0x1f)) < uVar10; uVar12 = uVar12 + 1) {
        TileSize[*(long *)(&DAT_002f2320 + (ulong)(uVar12 & 1) * 8)] =
             TileSize[*(long *)(&DAT_002f2320 + (ulong)(uVar12 & 1) * 8)] >> 1;
      }
    }
    goto LAB_002835c9;
  }
  if (pTVar6->ComponentType == COMPONENT_TYPE_COMPRESSED) {
    FormatString<char[26],char[54]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"FmtAttribs.ComponentType != COMPONENT_TYPE_COMPRESSED",Args_1);
    Args_1 = (char (*) [54])0xb53;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetStandardSparseTextureProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0xb53);
    std::__cxx11::string::~string((string *)&msg);
    uVar8 = TexDesc->SampleCount;
    if (uVar8 != 0) goto LAB_00283528;
LAB_0028352f:
    FormatString<char[26],char[34]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"IsPowerOfTwo(TexDesc.SampleCount)",(char (*) [34])Args_1);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetStandardSparseTextureProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0xb5c);
    std::__cxx11::string::~string((string *)&msg);
    uVar8 = TexDesc->SampleCount;
  }
  else {
LAB_00283528:
    if ((uVar8 & uVar8 - 1) != 0) goto LAB_0028352f;
  }
  __return_storage_ptr__->TileSize[0] = 0x80 >> (7 < uVar8);
  UVar5 = 0x100;
  if (3 < uVar8) {
    UVar5 = (uint)(uVar8 < 0x10) * 0x40 + 0x40;
  }
  __return_storage_ptr__->TileSize[1] = UVar5;
  __return_storage_ptr__->TileSize[2] = 1;
  for (uVar12 = 0; (uint)(1 << ((byte)uVar12 & 0x1f)) < uVar10; uVar12 = uVar12 + 1) {
    TileSize[*(long *)(&DAT_002f2320 + (ulong)(uVar12 & 1) * 8)] =
         TileSize[*(long *)(&DAT_002f2320 + (ulong)(uVar12 & 1) * 8)] >> 1;
  }
LAB_002835c9:
  uVar12 = 0;
  if ((__return_storage_ptr__->TileSize[0] / (uint)pTVar6->BlockWidth) * uVar10 *
      (__return_storage_ptr__->TileSize[1] / (uint)pTVar6->BlockHeight) *
      __return_storage_ptr__->TileSize[2] * uVar8 != 0x10000) {
    FormatString<char[26],char[32]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"BytesPerTile == SparseBlockSize",
               (char (*) [32])(ulong)__return_storage_ptr__->TileSize[1]);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetStandardSparseTextureProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0xb88);
    std::__cxx11::string::~string((string *)&msg);
  }
  __return_storage_ptr__->FirstMipInTail = 0xffffffff;
  UVar11 = 0;
  for (; uVar8 = TexDesc->MipLevels, uVar12 < uVar8; uVar12 = uVar12 + 1) {
    GetMipLevelProperties((MipLevelProperties *)&msg,TexDesc,uVar12);
    if ((((uint)msg._M_string_length < __return_storage_ptr__->TileSize[0]) ||
        (msg._M_string_length._4_4_ < __return_storage_ptr__->TileSize[1])) ||
       ((uint)msg.field_2._M_allocated_capacity._0_4_ < __return_storage_ptr__->TileSize[2])) {
      if (__return_storage_ptr__->FirstMipInTail == 0xffffffff) {
        __return_storage_ptr__->FirstMipInTail = uVar12;
        __return_storage_ptr__->MipTailOffset = UVar11;
      }
      __return_storage_ptr__->MipTailSize = __return_storage_ptr__->MipTailSize + local_50;
    }
    else {
      local_48.MinX = 0;
      local_48.MaxX = (uint)msg._M_string_length;
      local_48.MinY = 0;
      local_48.MaxY = msg._M_string_length._4_4_;
      local_48.MinZ = 0;
      local_48.MaxZ = msg.field_2._M_allocated_capacity._0_4_;
      uVar13 = GetNumSparseTilesInBox(&local_48,TileSize);
      UVar11 = UVar11 + (uVar13.field_0._0_8_ >> 0x10 & 0xffffffffffff0000) *
                        (ulong)uVar13.field_0._8_4_ * (ulong)uVar13.field_0._0_4_;
    }
  }
  uVar10 = __return_storage_ptr__->FirstMipInTail;
  if (uVar8 < __return_storage_ptr__->FirstMipInTail) {
    uVar10 = uVar8;
  }
  __return_storage_ptr__->FirstMipInTail = uVar10;
  uVar7 = __return_storage_ptr__->MipTailSize + 0xffff & 0xffffffffffff0000;
  __return_storage_ptr__->MipTailSize = uVar7;
  UVar11 = uVar7 + UVar11;
  RVar1 = TexDesc->Type;
  UVar9 = 0;
  if ((RVar1 < 9) && ((0x1a8U >> (RVar1 & 0x1f) & 1) != 0)) {
    UVar9 = UVar11;
  }
  __return_storage_ptr__->MipTailStride = UVar9;
  uVar7 = 1;
  if ((RVar1 < 9) && ((0x1a8U >> (RVar1 & 0x1f) & 1) != 0)) {
    uVar7 = (ulong)(TexDesc->field_3).ArraySize;
  }
  __return_storage_ptr__->AddressSpaceSize = uVar7 * UVar11;
  __return_storage_ptr__->BlockSize = 0x10000;
  __return_storage_ptr__->Flags = SPARSE_TEXTURE_FLAG_NONE;
  return __return_storage_ptr__;
}

Assistant:

SparseTextureProperties GetStandardSparseTextureProperties(const TextureDesc& TexDesc)
{
    constexpr Uint32            SparseBlockSize = 64 << 10;
    const TextureFormatAttribs& FmtAttribs      = GetTextureFormatAttribs(TexDesc.Format);
    const Uint32                TexelSize       = FmtAttribs.GetElementSize();
    VERIFY_EXPR(IsPowerOfTwo(TexelSize));
    VERIFY_EXPR(TexelSize >= 1 && TexelSize <= 16);
    VERIFY_EXPR(TexDesc.Is2D() || TexDesc.Is3D());
    VERIFY(TexDesc.MipLevels > 0, "Number of mipmap calculation is not supported");
    VERIFY(TexDesc.SampleCount == 1 || TexDesc.MipLevels == 1, "Multisampled textures must have 1 mip level");

    SparseTextureProperties Props;

    if (TexDesc.Is3D())
    {
        DEV_CHECK_ERR(FmtAttribs.ComponentType != COMPONENT_TYPE_COMPRESSED, "Compressed sparse 3D textures are currently not supported");

        //  | Texel size  |    Tile shape   |
        //  |-------------|-----------------|
        //  |     8-Bit   |   64 x 32 x 32  |
        //  |    16-Bit   |   32 x 32 x 32  |
        //  |    32-Bit   |   32 x 32 x 16  |
        //  |    64-Bit   |   32 x 16 x 16  |
        //  |   128-Bit   |   16 x 16 x 16  |
        Props.TileSize[0] = 64;
        Props.TileSize[1] = 32;
        Props.TileSize[2] = 32;

        constexpr size_t Remap[] = {0, 2, 1};
        for (Uint32 i = 0; (1u << i) < TexelSize; ++i)
        {
            Props.TileSize[Remap[i % 3]] /= 2;
        }
    }
    else if (TexDesc.SampleCount > 1)
    {
        VERIFY_EXPR(FmtAttribs.ComponentType != COMPONENT_TYPE_COMPRESSED);

        //  | Texel size  |   Tile shape 2x  |   Tile shape 4x  |   Tile shape 8x  |   Tile shape 16x  |
        //  |-------------|------------------|------------------|------------------|-------------------|
        //  |     8-Bit   |   128 x 256 x 1  |   128 x 128 x 1  |   64 x 128 x 1   |    64 x 64 x 1    |
        //  |    16-Bit   |   128 x 128 x 1  |   128 x  64 x 1  |   64 x  64 x 1   |    64 x 32 x 1    |
        //  |    32-Bit   |    64 x 128 x 1  |    64 x  64 x 1  |   32 x  64 x 1   |    32 x 32 x 1    |
        //  |    64-Bit   |    64 x  64 x 1  |    64 x  32 x 1  |   32 x  32 x 1   |    32 x 16 x 1    |
        //  |   128-Bit   |    32 x  64 x 1  |    32 x  32 x 1  |   16 x  32 x 1   |    16 x 16 x 1    |
        VERIFY_EXPR(IsPowerOfTwo(TexDesc.SampleCount));
        Props.TileSize[0] = 128 >> (TexDesc.SampleCount >= 8 ? 1 : 0);
        Props.TileSize[1] = 256 >> (TexDesc.SampleCount >= 4 ? (TexDesc.SampleCount >= 16 ? 2 : 1) : 0);
        Props.TileSize[2] = 1;

        constexpr size_t Remap[] = {1, 0};
        for (Uint32 i = 0; (1u << i) < TexelSize; ++i)
        {
            Props.TileSize[Remap[i & 1]] /= 2;
        }
    }
    else
    {
        Props.TileSize[0] = 256;
        Props.TileSize[1] = 256;
        Props.TileSize[2] = 1;
        if (FmtAttribs.ComponentType != COMPONENT_TYPE_COMPRESSED)
        {
            //  | Texel size  |    Tile shape   |
            //  |-------------|-----------------|
            //  |     8-Bit   |  256 x 256 x 1  |
            //  |    16-Bit   |  256 x 128 x 1  |
            //  |    32-Bit   |  128 x 128 x 1  |
            //  |    64-Bit   |  128 x  64 x 1  |
            //  |   128-Bit   |   64 x  64 x 1  |
            constexpr size_t Remap[] = {1, 0};
            for (Uint32 i = 0; (1u << i) < TexelSize; ++i)
            {
                Props.TileSize[Remap[i & 1]] /= 2;
            }
        }
        else
        {
            for (Uint32 i = 0; (FmtAttribs.ComponentSize << i) < (FmtAttribs.BlockWidth * FmtAttribs.BlockHeight); ++i)
            {
                Props.TileSize[i & 1] *= 2;
            }
        }
    }

    const Uint32 BytesPerTile =
        (Props.TileSize[0] / FmtAttribs.BlockWidth) *
        (Props.TileSize[1] / FmtAttribs.BlockHeight) *
        Props.TileSize[2] * TexDesc.SampleCount * TexelSize;
    VERIFY_EXPR(BytesPerTile == SparseBlockSize);

    Uint64 SliceSize     = 0;
    Props.FirstMipInTail = ~0u;
    for (Uint32 Mip = 0; Mip < TexDesc.MipLevels; ++Mip)
    {
        const MipLevelProperties MipProps  = GetMipLevelProperties(TexDesc, Mip);
        const Uint32             MipWidth  = MipProps.StorageWidth;
        const Uint32             MipHeight = MipProps.StorageHeight;
        const Uint32             MipDepth  = MipProps.Depth;

        // When the size of a texture mipmap level is at least one standard tile shape for its
        // format, the mipmap level is guaranteed to be nonpacked.
        const bool IsUnpacked =
            MipWidth >= Props.TileSize[0] &&
            MipHeight >= Props.TileSize[1] &&
            MipDepth >= Props.TileSize[2];

        if (!IsUnpacked)
        {
            // Mip tail
            if (Props.FirstMipInTail == ~0u)
            {
                Props.FirstMipInTail = Mip;
                Props.MipTailOffset  = SliceSize;
            }
            Props.MipTailSize += MipProps.MipSize;
        }
        else
        {
            const uint3 NumTilesInMip = GetNumSparseTilesInBox(Box{0, MipWidth, 0, MipHeight, 0, MipDepth}, Props.TileSize);
            SliceSize += Uint64{NumTilesInMip.x} * NumTilesInMip.y * NumTilesInMip.z * SparseBlockSize;
        }
    }

    Props.FirstMipInTail   = std::min(Props.FirstMipInTail, TexDesc.MipLevels);
    Props.MipTailSize      = AlignUp(Props.MipTailSize, SparseBlockSize);
    SliceSize              = SliceSize + Props.MipTailSize;
    Props.MipTailStride    = TexDesc.IsArray() ? SliceSize : 0;
    Props.AddressSpaceSize = SliceSize * TexDesc.GetArraySize();
    Props.BlockSize        = SparseBlockSize;
    Props.Flags            = SPARSE_TEXTURE_FLAG_NONE;

    VERIFY_EXPR(Props.MipTailSize % SparseBlockSize == 0);
    VERIFY_EXPR(Props.MipTailStride % SparseBlockSize == 0);
    VERIFY_EXPR(Props.AddressSpaceSize % SparseBlockSize == 0);

    return Props;
}